

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O1

void __thiscall
TTD::SnapShot::EmitSnapshotToFile(SnapShot *this,FileWriter *writer,ThreadContext *threadContext)

{
  uint64 val;
  double dVar1;
  double dVar2;
  Separator SVar3;
  byte bVar4;
  uint32 uVar5;
  SlabBlock *pSVar6;
  LargeSlabBlock *pLVar7;
  uint64 val_00;
  SnapContext *snapCtx;
  uint *puVar8;
  FunctionBodyResolveInfo *fbInfo;
  SnapObject *snpObject;
  SnapContext *pSVar9;
  uint *puVar10;
  FunctionBodyResolveInfo *pFVar11;
  SnapObject *pSVar12;
  UnorderedArrayListLink *pUVar13;
  UnorderedArrayListLink *pUVar14;
  UnorderedArrayListLink *pUVar15;
  UnorderedArrayListLink *pUVar16;
  undefined1 auStack_58 [8];
  TTDTimer timer;
  
  auStack_58 = (undefined1  [8])0x0;
  timer.m_timer.data.cacheTick = 0;
  timer.m_timer.data.cacheSysTime = -NAN;
  timer.m_timer.data.previousDifference = (ULONGLONG)threadContext;
  dVar1 = PlatformAgnostic::DateTime::HiResTimer::Now((HiResTimer *)auStack_58);
  val_00 = 0;
  (*writer->_vptr_FileWriter[6])(writer,0);
  (*writer->_vptr_FileWriter[8])(writer,1);
  pSVar6 = (this->m_slabAllocator).m_headBlock;
  if (pSVar6 != (SlabBlock *)0x0) {
    val_00 = 0;
    do {
      val_00 = val_00 + (this->m_slabAllocator).m_slabBlockSize;
      pSVar6 = pSVar6->Previous;
    } while (pSVar6 != (SlabBlock *)0x0);
  }
  for (pLVar7 = (this->m_slabAllocator).m_largeBlockList; pLVar7 != (LargeSlabBlock *)0x0;
      pLVar7 = pLVar7->Previous) {
    val_00 = val_00 + pLVar7->TotalBlockSize;
  }
  val = (this->m_slabAllocator).m_totalAllocatedSize;
  FileWriter::WriteDouble
            (writer,timeTotal,this->GCTime + this->MarkTime + this->ExtractTime,NoSeparator);
  FileWriter::WriteUInt64(writer,usedMemory,val,CommaSeparator);
  FileWriter::WriteUInt64(writer,reservedMemory,val_00,CommaSeparator);
  FileWriter::WriteDouble(writer,timeGC,this->GCTime,CommaSeparator);
  FileWriter::WriteDouble(writer,timeMark,this->MarkTime,CommaSeparator);
  FileWriter::WriteDouble(writer,timeExtract,this->ExtractTime,CommaSeparator);
  uVar5 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count(&this->m_ctxList);
  FileWriter::WriteLengthValue(writer,uVar5,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  pSVar9 = (this->m_ctxList).m_inlineHeadBlock.CurrPos;
  snapCtx = (this->m_ctxList).m_inlineHeadBlock.BlockData;
  if (snapCtx != (SnapContext *)0x0 && snapCtx != pSVar9) {
    pUVar13 = (this->m_ctxList).m_inlineHeadBlock.Next;
    SVar3 = BigSpaceSeparator;
    do {
      NSSnapValues::EmitSnapContext(snapCtx,writer,SVar3);
      snapCtx = snapCtx + 1;
      if (snapCtx == pSVar9) {
        if (pUVar13 == (UnorderedArrayListLink *)0x0) {
          snapCtx = (SnapContext *)0x0;
        }
        else {
          pSVar9 = pUVar13->CurrPos;
          snapCtx = pUVar13->BlockData;
          pUVar13 = pUVar13->Next;
        }
      }
      SVar3 = CommaAndBigSpaceSeparator;
    } while (snapCtx != (SnapContext *)0x0);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  uVar5 = UnorderedArrayList<int,_32UL>::Count(&this->m_tcSymbolRegistrationMapContents);
  FileWriter::WriteLengthValue(writer,uVar5,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  puVar8 = (uint *)(this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.CurrPos;
  puVar10 = (uint *)(this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.BlockData;
  if (puVar10 != (uint *)0x0 && puVar10 != puVar8) {
    pUVar14 = (this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.Next;
    bVar4 = 0;
    do {
      (*writer->_vptr_FileWriter[0xe])(writer,(ulong)*puVar10,(ulong)bVar4);
      puVar10 = puVar10 + 1;
      if (puVar10 == puVar8) {
        if (pUVar14 == (UnorderedArrayListLink *)0x0) {
          puVar10 = (uint *)0x0;
        }
        else {
          puVar8 = (uint *)pUVar14->CurrPos;
          puVar10 = (uint *)pUVar14->BlockData;
          pUVar14 = pUVar14->Next;
        }
      }
      bVar4 = 1;
    } while (puVar10 != (uint *)0x0);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLogTag(writer,ctxTag,this->m_activeScriptContext,CommaAndBigSpaceSeparator);
  EmitListHelper<void(*)(TTD::NSSnapValues::SnapRootInfoEntry_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SnapRootInfoEntry,512ul>
            (SnapRootPinEntryEmit,&this->m_rootList,writer);
  EmitListHelper<void(*)(TTD::NSSnapType::SnapHandler_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapType::SnapHandler,2048ul>
            (NSSnapType::EmitSnapHandler,&this->m_handlerList,writer);
  EmitListHelper<void(*)(TTD::NSSnapType::SnapType_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapType::SnapType,2048ul>
            (NSSnapType::EmitSnapType,&this->m_typeList,writer);
  uVar5 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Count
                    (&this->m_functionBodyList);
  FileWriter::WriteLengthValue(writer,uVar5,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  pFVar11 = (this->m_functionBodyList).m_inlineHeadBlock.CurrPos;
  fbInfo = (this->m_functionBodyList).m_inlineHeadBlock.BlockData;
  if (fbInfo != (FunctionBodyResolveInfo *)0x0 && fbInfo != pFVar11) {
    pUVar15 = (this->m_functionBodyList).m_inlineHeadBlock.Next;
    SVar3 = BigSpaceSeparator;
    do {
      NSSnapValues::EmitFunctionBodyInfo(fbInfo,writer,SVar3);
      fbInfo = fbInfo + 1;
      if (fbInfo == pFVar11) {
        if (pUVar15 == (UnorderedArrayListLink *)0x0) {
          fbInfo = (FunctionBodyResolveInfo *)0x0;
        }
        else {
          pFVar11 = pUVar15->CurrPos;
          fbInfo = pUVar15->BlockData;
          pUVar15 = pUVar15->Next;
        }
      }
      SVar3 = CommaAndBigSpaceSeparator;
    } while (fbInfo != (FunctionBodyResolveInfo *)0x0);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  EmitListHelper<void(*)(TTD::NSSnapValues::SnapPrimitiveValue_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SnapPrimitiveValue,4096ul>
            (NSSnapValues::EmitSnapPrimitiveValue,&this->m_primitiveObjectList,writer);
  uVar5 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                    (&this->m_compoundObjectList);
  FileWriter::WriteLengthValue(writer,uVar5,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  pSVar12 = (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  snpObject = (this->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (snpObject != (SnapObject *)0x0 && snpObject != pSVar12) {
    pUVar16 = (this->m_compoundObjectList).m_inlineHeadBlock.Next;
    SVar3 = BigSpaceSeparator;
    do {
      NSSnapObjects::EmitObject
                (snpObject,writer,SVar3,this->m_snapObjectVTableArray,
                 (ThreadContext *)timer.m_timer.data.previousDifference);
      snpObject = snpObject + 1;
      if (snpObject == pSVar12) {
        if (pUVar16 == (UnorderedArrayListLink *)0x0) {
          snpObject = (SnapObject *)0x0;
        }
        else {
          pSVar12 = pUVar16->CurrPos;
          snpObject = pUVar16->BlockData;
          pUVar16 = pUVar16->Next;
        }
      }
      SVar3 = CommaAndBigSpaceSeparator;
    } while (snpObject != (SnapObject *)0x0);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  EmitListHelper<void(*)(TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::ScriptFunctionScopeInfo,2048ul>
            (NSSnapValues::EmitScriptFunctionScopeInfo,&this->m_scopeEntries,writer);
  EmitListHelper<void(*)(TTD::NSSnapValues::SlotArrayInfo_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SlotArrayInfo,2048ul>
            (NSSnapValues::EmitSlotArrayInfo,&this->m_slotArrayEntries,writer);
  dVar2 = PlatformAgnostic::DateTime::HiResTimer::Now((HiResTimer *)auStack_58);
  FileWriter::WriteDouble(writer,timeWrite,(dVar2 - dVar1) / 1000.0,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[7])(writer,2);
  return;
}

Assistant:

void SnapShot::EmitSnapshotToFile(FileWriter* writer, ThreadContext* threadContext) const
    {
        TTDTimer timer;
        double startWrite = timer.Now();

        writer->WriteRecordStart();
        writer->AdjustIndent(1);

        uint64 usedSpace = 0;
        uint64 reservedSpace = 0;
        this->ComputeSnapshotMemory(&usedSpace, &reservedSpace);

        writer->WriteDouble(NSTokens::Key::timeTotal, this->GCTime + this->MarkTime + this->ExtractTime);
        writer->WriteUInt64(NSTokens::Key::usedMemory, usedSpace, NSTokens::Separator::CommaSeparator);
        writer->WriteUInt64(NSTokens::Key::reservedMemory, reservedSpace, NSTokens::Separator::CommaSeparator);
        writer->WriteDouble(NSTokens::Key::timeGC, this->GCTime, NSTokens::Separator::CommaSeparator);
        writer->WriteDouble(NSTokens::Key::timeMark, this->MarkTime, NSTokens::Separator::CommaSeparator);
        writer->WriteDouble(NSTokens::Key::timeExtract, this->ExtractTime, NSTokens::Separator::CommaSeparator);

        writer->WriteLengthValue(this->m_ctxList.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->AdjustIndent(1);
        bool firstCtx = true;
        for(auto iter = this->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapValues::EmitSnapContext(iter.Current(), writer, firstCtx ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);

            firstCtx = false;
        }
        writer->AdjustIndent(-1);
        writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

        writer->WriteLengthValue(this->m_tcSymbolRegistrationMapContents.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
        bool firstTCSymbol = true;
        for(auto iter = this->m_tcSymbolRegistrationMapContents.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            writer->WriteNakedUInt32((uint32)*iter.Current(), firstTCSymbol ? NSTokens::Separator::NoSeparator : NSTokens::Separator::CommaSeparator);

            firstTCSymbol = false;
        }
        writer->WriteSequenceEnd();

        writer->WriteLogTag(NSTokens::Key::ctxTag, this->m_activeScriptContext, NSTokens::Separator::CommaAndBigSpaceSeparator);
        SnapShot::EmitListHelper(&SnapShot::SnapRootPinEntryEmit, this->m_rootList, writer);

        ////
        SnapShot::EmitListHelper(&NSSnapType::EmitSnapHandler, this->m_handlerList, writer);
        SnapShot::EmitListHelper(&NSSnapType::EmitSnapType, this->m_typeList, writer);

        ////
        writer->WriteLengthValue(this->m_functionBodyList.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->AdjustIndent(1);
        bool firstBody = true;
        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapValues::EmitFunctionBodyInfo(iter.Current(), writer, firstBody ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);

            firstBody = false;
        }
        writer->AdjustIndent(-1);
        writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

        SnapShot::EmitListHelper(&NSSnapValues::EmitSnapPrimitiveValue, this->m_primitiveObjectList, writer);

        writer->WriteLengthValue(this->m_compoundObjectList.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->AdjustIndent(1);
        bool firstObj = true;
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapObjects::EmitObject(iter.Current(), writer, firstObj ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator, this->m_snapObjectVTableArray, threadContext);

            firstObj = false;
        }
        writer->AdjustIndent(-1);
        writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

        ////
        SnapShot::EmitListHelper(&NSSnapValues::EmitScriptFunctionScopeInfo, this->m_scopeEntries, writer);
        SnapShot::EmitListHelper(&NSSnapValues::EmitSlotArrayInfo, this->m_slotArrayEntries, writer);

        ////
        double almostEndWrite = timer.Now();
        writer->WriteDouble(NSTokens::Key::timeWrite, (almostEndWrite - startWrite) / 1000.0, NSTokens::Separator::CommaAndBigSpaceSeparator);

        writer->AdjustIndent(-1);
        writer->WriteRecordEnd(NSTokens::Separator::BigSpaceSeparator);
    }